

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * file_contents(string *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  runtime_error *this;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_251;
  undefined1 local_250 [12];
  undefined1 local_240 [2] [12];
  long local_220;
  ifstream ifs;
  string *filename_local;
  
  std::ifstream::ifstream(&local_220,(string *)filename,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_240,
               (istream_type *)&local_220);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_250);
    std::allocator<char>::allocator();
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_240[0]._0_8_;
    __beg._M_c = local_240[0]._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_250._0_8_;
    __end._M_c = local_250._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,__beg,__end,&local_251);
    std::allocator<char>::~allocator(&local_251);
    std::ifstream::~ifstream(&local_220);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Failed open file ");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string file_contents(const std::string &filename)
{
    std::ifstream ifs(filename);
    if (!ifs)
        throw std::runtime_error("Failed open file ");
    return std::string((std::istreambuf_iterator<char>(ifs)), (std::istreambuf_iterator<char>()));
}